

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6522Implementation.hpp
# Opt level: O2

int __thiscall
MOS::MOS6522::MOS6522<Commodore::Vic20::KeyboardVIA>::access
          (MOS6522<Commodore::Vic20::KeyboardVIA> *this,char *__name,int __type)

{
  int in_EAX;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar1;
  
  iVar1 = (int)__name;
  if ((iVar1 == 0xf) || (iVar1 == 1)) {
    if ((this->super_MOS6522Storage).handshake_modes_[0] != None) {
      set_control_line_output(this,A,Two,Off);
      return extraout_EAX_00;
    }
  }
  else if ((iVar1 == 0) && ((this->super_MOS6522Storage).handshake_modes_[1] != None)) {
    (this->super_MOS6522Storage).control_outputs_[1].lines[1] = Off;
    evaluate_cb2_output(this);
    return extraout_EAX;
  }
  return in_EAX;
}

Assistant:

void MOS6522<T>::access(int address) {
	switch(address) {
		case 0x0:
			// In both handshake and pulse modes, CB2 goes low on any read or write of Port B.
			if(handshake_modes_[1] != HandshakeMode::None) {
				set_control_line_output(Port::B, Line::Two, LineState::Off);
			}
		break;

		case 0xf:
		case 0x1:
			// In both handshake and pulse modes, CA2 goes low on any read or write of Port A.
			if(handshake_modes_[0] != HandshakeMode::None) {
				set_control_line_output(Port::A, Line::Two, LineState::Off);
			}
		break;
	}
}